

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O0

void __thiscall
EnvTestingSetup::EnvTestingSetup(EnvTestingSetup *this,ChainType chainType,TestOpts *opts)

{
  long lVar1;
  Level LVar2;
  long in_RDI;
  long in_FS_OFFSET;
  TestOpts *in_stack_000000e0;
  ChainType in_stack_000000ec;
  BasicTestingSetup *in_stack_000000f0;
  Logger *in_stack_ffffffffffffff58;
  TestOpts *in_stack_ffffffffffffff60;
  TestOpts *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestOpts::TestOpts(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  BasicTestingSetup::BasicTestingSetup(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
  TestOpts::~TestOpts((TestOpts *)in_stack_ffffffffffffff58);
  LogInstance();
  LVar2 = BCLog::Logger::LogLevel(in_stack_ffffffffffffff58);
  *(Level *)(in_RDI + 0x438) = LVar2;
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::function
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             CONCAT44(LVar2,in_stack_ffffffffffffff78),
             (function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             (in_RDI + 0x440));
  LogInstance();
  BCLog::Logger::SetLogLevel(in_stack_ffffffffffffff58,Trace);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit EnvTestingSetup(const ChainType chainType = ChainType::MAIN,
                             TestOpts opts = {})
        : BasicTestingSetup{chainType, opts},
          m_prev_log_level{LogInstance().LogLevel()},
          m_create_sock_orig{CreateSock}
    {
        LogInstance().SetLogLevel(BCLog::Level::Trace);
    }